

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-optimizer.cpp
# Opt level: O1

bool is_best(context *ctx,result *current,result *best,objective_function_type type)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  
  if (current->status == success) {
    bVar3 = true;
    if (best->status == success) {
      dVar1 = ((current->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_start)->value;
      dVar2 = ((best->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_start)->value;
      if (type == maximize) {
        bVar3 = dVar1 < dVar2;
      }
      else {
        bVar3 = dVar2 < dVar1;
      }
      bVar3 = !bVar3 && dVar2 != dVar1;
    }
  }
  else if (best->status == success) {
    bVar3 = false;
  }
  else {
    bVar3 = current->constraints < best->constraints;
  }
  if (bVar3 != false) {
    if (current->status == success) {
      baryonyx::notice<double>
                (ctx,"  - branch optimization found solution {:G}\n",
                 &((current->solutions).
                   super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
                   _M_impl.super__Vector_impl_data._M_start)->value);
    }
    else {
      baryonyx::notice<int>
                (ctx,"  - branch optimization remaining_constraint {}\n",
                 &current->remaining_constraints);
    }
  }
  return bVar3;
}

Assistant:

static bool
is_best(const baryonyx::context& ctx,
        const baryonyx::result& current,
        const baryonyx::result& best,
        baryonyx::objective_function_type type)
{
    if (is_best(current, best, type)) {
        if (current)
            baryonyx::notice(ctx,
                             "  - branch optimization found solution {:G}\n",
                             current.solutions.front().value);
        else
            baryonyx::notice(
              ctx,
              "  - branch optimization remaining_constraint {}\n",
              current.remaining_constraints);

        return true;
    }

    return false;
}